

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O3

void __thiscall
leveldb::CacheTest_EntriesArePinned_Test::TestBody(CacheTest_EntriesArePinned_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Cache *pCVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  string result;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  string local_48;
  
  CacheTest::Insert(&this->super_CacheTest,100,0x65,1);
  pCVar2 = (this->super_CacheTest).cache_;
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  PutFixed32(&local_48,100);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_48._M_dataplus._M_p;
  uStack_50 = (undefined4)local_48._M_string_length;
  uStack_4c = local_48._M_string_length._4_4_;
  iVar4 = (*pCVar2->_vptr_Cache[3])(pCVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_58._M_head_impl._0_4_ = 0x65;
  pCVar2 = (this->super_CacheTest).cache_;
  local_60.data_._0_4_ = (*pCVar2->_vptr_Cache[5])(pCVar2,CONCAT44(extraout_var,iVar4));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"101","DecodeValue(cache_->Value(h1))",(int *)&local_58,
             (int *)&local_60);
  sVar3 = local_48._M_string_length;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_48._M_string_length;
    }
    iVar4 = 0x70;
LAB_0010a34a:
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
               ,iVar4,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    sVar3 = local_48._M_string_length;
    if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_48._M_string_length !=
          (undefined8 *)(local_48._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_48._M_string_length);
      }
      operator_delete((void *)sVar3);
    }
    return;
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  CacheTest::Insert(&this->super_CacheTest,100,0x66,1);
  pCVar2 = (this->super_CacheTest).cache_;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  PutFixed32(&local_48,100);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_48._M_dataplus._M_p;
  uStack_50 = (undefined4)local_48._M_string_length;
  uStack_4c = local_48._M_string_length._4_4_;
  iVar5 = (*pCVar2->_vptr_Cache[3])(pCVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_58._M_head_impl._0_4_ = 0x66;
  pCVar2 = (this->super_CacheTest).cache_;
  local_60.data_._0_4_ = (*pCVar2->_vptr_Cache[5])(pCVar2,CONCAT44(extraout_var_00,iVar5));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"102","DecodeValue(cache_->Value(h2))",(int *)&local_58,
             (int *)&local_60);
  sVar3 = local_48._M_string_length;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_48._M_string_length;
    }
    iVar4 = 0x74;
    goto LAB_0010a34a;
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_60.data_._0_4_ = 0;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_48,"0","deleted_keys_.size()",(int *)&local_60,
             (unsigned_long *)&local_58);
  sVar3 = local_48._M_string_length;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_48._M_string_length;
    }
    iVar4 = 0x75;
    goto LAB_0010a34a;
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  pCVar2 = (this->super_CacheTest).cache_;
  (*pCVar2->_vptr_Cache[4])(pCVar2,CONCAT44(extraout_var,iVar4));
  local_60.data_._0_4_ = 1;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_48,"1","deleted_keys_.size()",(int *)&local_60,
             (unsigned_long *)&local_58);
  sVar3 = local_48._M_string_length;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_48._M_string_length;
    }
    iVar4 = 0x78;
    goto LAB_0010a34a;
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_58._M_head_impl._0_4_ = 100;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"100","deleted_keys_[0]",(int *)&local_58,
             (this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  sVar3 = local_48._M_string_length;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_48._M_string_length;
    }
    iVar4 = 0x79;
    goto LAB_0010a34a;
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_58._M_head_impl._0_4_ = 0x65;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"101","deleted_values_[0]",(int *)&local_58,
             (this->super_CacheTest).deleted_values_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_48._M_string_length;
    }
    iVar4 = 0x7a;
  }
  else {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_48);
    CacheTest::Erase(&this->super_CacheTest,100);
    local_58._M_head_impl._0_4_ = 0xffffffff;
    local_60.data_._0_4_ = CacheTest::Lookup(&this->super_CacheTest,100);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_48,"-1","Lookup(100)",(int *)&local_58,(int *)&local_60);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_48._M_string_length;
      }
      iVar4 = 0x7d;
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_48);
      local_60.data_._0_4_ = 1;
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(this->super_CacheTest).deleted_keys_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)(this->super_CacheTest).deleted_keys_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&local_48,"1","deleted_keys_.size()",(int *)&local_60,
                 (unsigned_long *)&local_58);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_58);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)local_48._M_string_length;
        }
        iVar4 = 0x7e;
      }
      else {
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_48);
        pCVar2 = (this->super_CacheTest).cache_;
        (*pCVar2->_vptr_Cache[4])(pCVar2,CONCAT44(extraout_var_00,iVar5));
        local_60.data_._0_4_ = 2;
        local_58._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2);
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_48,"2","deleted_keys_.size()",(int *)&local_60,
                   (unsigned_long *)&local_58);
        if ((char)local_48._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_58);
          if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)local_48._M_string_length;
          }
          iVar4 = 0x81;
        }
        else {
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_48);
          local_58._M_head_impl._0_4_ = 100;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_48,"100","deleted_keys_[1]",(int *)&local_58,
                     (this->super_CacheTest).deleted_keys_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + 1);
          if ((char)local_48._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_58);
            if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)local_48._M_string_length;
            }
            iVar4 = 0x82;
          }
          else {
            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_48);
            local_58._M_head_impl._0_4_ = 0x66;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_48,"102","deleted_values_[1]",(int *)&local_58,
                       (this->super_CacheTest).deleted_values_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + 1);
            if ((char)local_48._M_dataplus._M_p != '\0') goto LAB_0010a505;
            testing::Message::Message((Message *)&local_58);
            if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)local_48._M_string_length;
            }
            iVar4 = 0x83;
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
             ,iVar4,pcVar6);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_0010a505:
  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_48);
  return;
}

Assistant:

TEST_F(CacheTest, EntriesArePinned) {
  Insert(100, 101);
  Cache::Handle* h1 = cache_->Lookup(EncodeKey(100));
  ASSERT_EQ(101, DecodeValue(cache_->Value(h1)));

  Insert(100, 102);
  Cache::Handle* h2 = cache_->Lookup(EncodeKey(100));
  ASSERT_EQ(102, DecodeValue(cache_->Value(h2)));
  ASSERT_EQ(0, deleted_keys_.size());

  cache_->Release(h1);
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(1, deleted_keys_.size());

  cache_->Release(h2);
  ASSERT_EQ(2, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[1]);
  ASSERT_EQ(102, deleted_values_[1]);
}